

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O2

void mnf::ExpMapMatrix::forceOnM_(RefVec *out,ConstRefVec *in)

{
  Scalar SVar1;
  bool bVar2;
  toMat3 Q;
  toConstMat3 inMat;
  undefined1 local_230 [16];
  XprTypeNested local_220;
  undefined2 local_218;
  variable_if_dynamic<long,__1> local_210;
  variable_if_dynamic<long,__1> vStack_208;
  Index local_200;
  scalar_constant_op<double> local_1f0;
  BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
  local_1e0;
  undefined1 local_1a8 [64];
  XprTypeNested local_168;
  undefined2 local_160;
  variable_if_dynamic<long,__1> local_158;
  variable_if_dynamic<long,__1> vStack_150;
  Index local_148;
  scalar_constant_op<double> local_138;
  Matrix3d R;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_d8;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_a8;
  Matrix3d A;
  
  inMat.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (in->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  local_1a8._8_2_ =
       inMat.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
       ._8_2_;
  local_1a8._24_2_ =
       inMat.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
       ._8_2_;
  local_1a8._0_8_ =
       inMat.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_data;
  local_1a8._16_8_ =
       inMat.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_data;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_230._0_8_ = (PointerType)0x3fb999999999999a;
  bVar2 = Eigen::internal::
          isApprox_selector<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_false>
          ::run((Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                 *)local_1a8,
                (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                 *)&A,(RealScalar *)local_230);
  if (bVar2) {
    SVar1 = Eigen::internal::
            determinant_impl<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3>
            ::run(&inMat);
    if (ABS(SVar1 + -1.0) < 0.1) {
      bVar2 = true;
      goto LAB_0015cda5;
    }
  }
  bVar2 = false;
LAB_0015cda5:
  mnf_assert(bVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&A,
             (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
              *)&inMat);
  Q._0_8_ = *(undefined8 *)
             &out->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_1a8,(Matrix<double,_3,_3,_0,_3,_3> *)&A,0);
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                 ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                  local_1a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_1e0,(Matrix<double,_3,_3,_0,_3,_3> *)&A,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
            ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_1a8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_1e0,
             (double *)&R);
  Eigen::internal::
  BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
  ::BlockImpl_dense((BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
                     *)local_230,&Q,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>
              *)local_230,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_1a8);
  Eigen::internal::
  BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
  ::BlockImpl_dense((BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
                     *)local_1a8,&Q,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_230,(Matrix<double,_3,_3,_0,_3,_3> *)&A,1);
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       Eigen::internal::
       dot_nocheck<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
       ::run((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>_>
              *)local_1a8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             local_230);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_a8,(Matrix<double,_3,_3,_0,_3,_3> *)&A,1);
  Eigen::internal::
  BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
  ::BlockImpl_dense(&local_1e0,&Q,0);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_230,
              (MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
               *)&local_1e0,
              R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 3);
  local_1a8._32_8_ = local_a8.m_startCol.m_value;
  local_1a8._40_8_ = local_a8.m_outerStride;
  local_1a8._16_8_ = local_a8.m_xpr;
  local_1a8._24_8_ = local_a8.m_startRow.m_value;
  local_1a8._0_8_ =
       local_a8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data;
  local_1a8._8_8_ =
       local_a8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>._8_8_;
  local_1a8._48_8_ = local_230._0_8_;
  local_1a8._56_8_ = local_230._8_8_;
  local_168 = local_220;
  local_160 = local_218;
  local_158.m_value = local_210.m_value;
  vStack_150.m_value = vStack_208.m_value;
  local_148 = local_200;
  local_138.m_other = local_1f0.m_other;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_d8,(Matrix<double,_3,_3,_0,_3,_3> *)&A,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_d8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_1a8);
  Eigen::internal::
  BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
  ::BlockImpl_dense((BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
                     *)local_1a8,&Q,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_230,(Matrix<double,_3,_3,_0,_3,_3> *)&A,2);
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       Eigen::internal::
       dot_nocheck<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
       ::run((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>_>
              *)local_1a8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             local_230);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_a8,(Matrix<double,_3,_3,_0,_3,_3> *)&A,2);
  Eigen::internal::
  BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
  ::BlockImpl_dense(&local_1e0,&Q,0);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_230,
              (MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
               *)&local_1e0,
              R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 6);
  local_1a8._32_8_ = local_a8.m_startCol.m_value;
  local_1a8._40_8_ = local_a8.m_outerStride;
  local_1a8._16_8_ = local_a8.m_xpr;
  local_1a8._24_8_ = local_a8.m_startRow.m_value;
  local_1a8._0_8_ =
       local_a8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data;
  local_1a8._8_8_ =
       local_a8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>._8_8_;
  local_1a8._48_8_ = local_230._0_8_;
  local_1a8._56_8_ = local_230._8_8_;
  local_168 = local_220;
  local_160 = local_218;
  local_158.m_value = local_210.m_value;
  vStack_150.m_value = vStack_208.m_value;
  local_148 = local_200;
  local_138.m_other = local_1f0.m_other;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_d8,(Matrix<double,_3,_3,_0,_3,_3> *)&A,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_d8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_1a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_1a8,(Matrix<double,_3,_3,_0,_3,_3> *)&A,1);
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                 ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                  local_1a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_1e0,(Matrix<double,_3,_3,_0,_3,_3> *)&A,1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
            ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_1a8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_1e0,
             R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             4);
  Eigen::internal::
  BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
  ::BlockImpl_dense((BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
                     *)local_230,&Q,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>
              *)local_230,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_1a8);
  Eigen::internal::
  BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
  ::BlockImpl_dense((BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
                     *)local_1a8,&Q,1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_230,&A,2);
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       Eigen::internal::
       dot_nocheck<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
       ::run((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>_>
              *)local_1a8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             local_230);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_a8,&A,2);
  Eigen::internal::
  BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
  ::BlockImpl_dense(&local_1e0,&Q,1);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_230,
              (MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>>
               *)&local_1e0,
              R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 7);
  local_1a8._32_8_ = local_a8.m_startCol.m_value;
  local_1a8._40_8_ = local_a8.m_outerStride;
  local_1a8._16_8_ = local_a8.m_xpr;
  local_1a8._24_8_ = local_a8.m_startRow.m_value;
  local_1a8._0_8_ =
       local_a8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data;
  local_1a8._8_8_ =
       local_a8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>._8_8_;
  local_1a8._48_8_ = local_230._0_8_;
  local_1a8._56_8_ = local_230._8_8_;
  local_168 = local_220;
  local_160 = local_218;
  local_158.m_value = local_210.m_value;
  vStack_150.m_value = vStack_208.m_value;
  local_148 = local_200;
  local_138.m_other = local_1f0.m_other;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_d8,&A,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_d8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_1a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_1a8,&A,2);
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                 ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                  local_1a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_1e0,&A,2);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
            ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_1a8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_1e0,
             R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             8);
  Eigen::internal::
  BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
  ::BlockImpl_dense((BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true,_true>
                     *)local_230,&Q,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_true>
              *)local_230,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_1a8);
  return;
}

Assistant:

void ExpMapMatrix::forceOnM_(RefVec out, const ConstRefVec& in)
{
  toConstMat3 inMat(in.data());
  mnf_assert(
      (inMat.transpose() * inMat).isApprox(Eigen::Matrix3d::Identity(), 0.1) &&
      fabs(inMat.determinant() - 1.0) < 0.1 &&
      "Provided matrix is too far from being a rotation matrix. You should use "
      "createRandomPoint instead of forceOnM");
  Eigen::Matrix3d A(
      inMat);  // TODO it is bad to copy it here. Maybe in shouldn't be const???
  toMat3 Q(out.data());
  Eigen::Matrix3d R;
  // the following scope contains the code to compute a QR on R3x3
  {
    // k = 0
    R(0, 0) = A.col(0).norm();
    Q.col(0) = A.col(0) / R(0, 0);
    // j = 1
    R(0, 1) = Q.col(0).dot(A.col(1));
    A.col(1) = A.col(1) - Q.col(0) * R(0, 1);
    // j = 2
    R(0, 2) = Q.col(0).dot(A.col(2));
    A.col(2) = A.col(2) - Q.col(0) * R(0, 2);
    // k = 1
    R(1, 1) = A.col(1).norm();
    Q.col(1) = A.col(1) / R(1, 1);
    // j = 2
    R(1, 2) = Q.col(1).dot(A.col(2));
    A.col(2) = A.col(2) - Q.col(1) * R(1, 2);
    // k = 2
    R(2, 2) = A.col(2).norm();
    Q.col(2) = A.col(2) / R(2, 2);
  }
}